

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O2

float xm_amiga_period(float note)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)((int)(((long)note & 0xffffffffU) % 0xc) << 2);
  iVar1 = *(int *)((long)amiga_frequencies + uVar4);
  iVar3 = *(int *)((long)amiga_frequencies + uVar4 + 4);
  bVar2 = (byte)(int)(note / 12.0 + -2.0);
  if ((char)bVar2 < '\x01') {
    if ((char)bVar2 < '\0') {
      iVar1 = iVar1 << (-bVar2 & 0x1f);
      iVar3 = iVar3 << (-bVar2 & 0x1f);
    }
  }
  else {
    iVar1 = iVar1 >> (bVar2 & 0x1f);
    iVar3 = iVar3 >> (bVar2 & 0x1f);
  }
  return ((float)(iVar3 - iVar1) * (note - (float)((long)note & 0xffffffff)) + (float)iVar1) *
         0.0009765625;
}

Assistant:

static float xm_amiga_period(float note) {
	unsigned int intnote = note;
	uint8_t a = intnote % 12;
	int8_t octave = note / 12.f - 2;
	int32_t p1 = amiga_frequencies[a], p2 = amiga_frequencies[a + 1];

	if(octave > 0) {
		p1 >>= octave;
		p2 >>= octave;
	} else if(octave < 0) {
		p1 <<= (-octave);
		p2 <<= (-octave);
	}

	return XM_LERP(p1, p2, note - intnote) / AMIGA_FREQ_SCALE;
}